

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O3

bool __thiscall
GLRParser::closure(GLRParser *this,
                  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                  *markedProductions,
                  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                  *allMarkedProductions)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  pointer pbVar3;
  size_t __n;
  size_t sVar4;
  pointer pbVar5;
  undefined8 uVar6;
  _Base_ptr p_Var7;
  bool bVar8;
  int iVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var12;
  _Base_ptr p_Var13;
  string *var;
  _Rb_tree_node_base *p_Var14;
  size_t sVar15;
  undefined8 uVar16;
  _Rb_tree_header *p_Var17;
  ulong uVar18;
  pointer pbVar19;
  string nextChar;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> initProductionsFromVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prodTo;
  Production *production;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prodTo2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prodTo1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  terminalsImmRightOfMarker;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> followingTerminalInit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  pointer local_148;
  undefined1 local_140 [16];
  _Rb_tree_node_base *local_130;
  GLRParser *local_118;
  _Rb_tree_node_base *local_110;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *local_108;
  _Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
  *local_100;
  undefined1 local_f8 [32];
  Production *local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  size_t local_a0;
  _Base_ptr local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  local_60;
  
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var13 = (markedProductions->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a0 = (markedProductions->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  local_110 = &(markedProductions->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_108 = allMarkedProductions;
  local_100 = (_Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
               *)markedProductions;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var13 != local_110) {
    p_Var17 = &(this->terminalsT)._M_t._M_impl.super__Rb_tree_header;
    local_98 = &(this->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_118 = this;
LAB_0012173b:
    pvVar10 = Production::getToP_abi_cxx11_(*(Production **)(p_Var13 + 1));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_f8,pvVar10);
    uVar6 = local_f8._8_8_;
    uVar16 = local_f8._0_8_;
    getMarker_abi_cxx11_();
    _Var11 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (uVar16,uVar6,&local_148);
    if (local_148 != (pointer)(local_140 + 8)) {
      operator_delete(local_148,(ulong)((long)(_Rb_tree_color *)local_140._8_8_ + 1));
    }
    uVar18 = ((long)_Var11._M_current - local_f8._0_8_) * 0x8000000 + 0x100000000 >> 0x20;
    if (uVar18 < (ulong)((long)(local_f8._8_8_ - local_f8._0_8_) >> 5)) {
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      pcVar2 = (((pointer)(local_f8._0_8_ + uVar18 * 0x20))->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_168,pcVar2,
                 pcVar2 + ((pointer)(local_f8._0_8_ + uVar18 * 0x20))->_M_string_length);
      local_148 = &local_168;
      for (_Var12._M_node =
                (local_118->terminalsT)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)_Var12._M_node != p_Var17;
          _Var12._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var12._M_node)) {
        bVar8 = __gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>::operator()
                          ((_Iter_equals_val<std::__cxx11::string_const> *)&local_148,_Var12);
        if (bVar8) {
          if ((_Rb_tree_header *)_Var12._M_node != p_Var17) {
            if ((ulong)((long)(local_f8._8_8_ - local_f8._0_8_) >> 5) <= uVar18) {
              uVar16 = std::__throw_out_of_range_fmt
                                 ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                  ,uVar18);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                operator_delete(local_168._M_dataplus._M_p,
                                CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                         local_168.field_2._M_local_buf[0]) + 1);
              }
              std::
              _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
              ::~_Rb_tree(&local_60);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree(&local_90);
              _Unwind_Resume(uVar16);
            }
            local_148 = (pointer)(local_f8._0_8_ + uVar18 * 0x20);
            p_Var1 = &local_90._M_impl.super__Rb_tree_header;
            _Var12._M_node = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
            goto joined_r0x0012186a;
          }
          break;
        }
      }
LAB_0012189d:
      p_Var7 = local_98;
      local_148 = &local_168;
      for (_Var12._M_node =
                (local_118->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          _Var12._M_node != p_Var7;
          _Var12._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var12._M_node)) {
        bVar8 = __gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>::operator()
                          ((_Iter_equals_val<std::__cxx11::string_const> *)&local_148,_Var12);
        if (bVar8) {
          if (_Var12._M_node != p_Var7) {
            initialProductionsFromVar
                      ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                       &local_148,&local_168,local_108);
            std::
            __set_union<std::_Rb_tree_const_iterator<Production*>,std::_Rb_tree_const_iterator<Production*>,std::insert_iterator<std::set<Production*,std::less<Production*>,std::allocator<Production*>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_60._M_impl.super__Rb_tree_header._M_header._M_left,
                       &local_60._M_impl.super__Rb_tree_header,local_130,local_140,&local_60,
                       local_60._M_impl.super__Rb_tree_header._M_header._M_left);
            std::
            _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
            ::~_Rb_tree((_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
                         *)&local_148);
          }
          break;
        }
      }
      goto LAB_00121935;
    }
    goto LAB_00121958;
  }
LAB_0012199c:
  std::
  __set_union<std::_Rb_tree_const_iterator<Production*>,std::_Rb_tree_const_iterator<Production*>,std::insert_iterator<std::set<Production*,std::less<Production*>,std::allocator<Production*>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (p_Var13,local_110,local_60._M_impl.super__Rb_tree_header._M_header._M_left,
             &local_60._M_impl.super__Rb_tree_header,local_100,p_Var13);
  p_Var13 = (local_108->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_118 = (GLRParser *)&(local_108->_M_t)._M_impl.super__Rb_tree_header;
  if ((GLRParser *)p_Var13 == local_118) {
LAB_00121caa:
    sVar15 = (size_t)(int)local_a0;
    sVar4 = *(size_t *)(local_100 + 0x28);
    std::
    _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_90);
    return sVar15 != sVar4;
  }
LAB_001219cc:
  local_d8 = *(Production **)(p_Var13 + 1);
  local_110 = p_Var13;
  pvVar10 = Production::getToP_abi_cxx11_(local_d8);
  pbVar3 = (pvVar10->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar19 = (pvVar10->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      p_Var17 = &local_90._M_impl.super__Rb_tree_header, pbVar19 != pbVar3; pbVar19 = pbVar19 + 1) {
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    local_168._M_string_length = 0;
    local_168.field_2._M_local_buf[0] = '\0';
    local_148 = pbVar19;
    _Var12._M_node = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      if ((_Rb_tree_header *)_Var12._M_node == p_Var17) goto LAB_00121c7a;
      bVar8 = __gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>::operator()
                        ((_Iter_equals_val<std::__cxx11::string_const> *)&local_148,_Var12);
      if (bVar8) break;
      _Var12._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var12._M_node);
    }
    if ((_Rb_tree_header *)_Var12._M_node == p_Var17) goto LAB_00121c7a;
    getMarker_abi_cxx11_();
    pbVar5 = local_148;
    __n = pbVar19->_M_string_length;
    if (__n == local_140._0_8_) {
      if (__n == 0) {
        bVar8 = true;
      }
      else {
        iVar9 = bcmp((pbVar19->_M_dataplus)._M_p,local_148,__n);
        bVar8 = iVar9 == 0;
      }
    }
    else {
      bVar8 = false;
    }
    if (pbVar5 != (pointer)(local_140 + 8)) {
      operator_delete(pbVar5,(ulong)((long)(_Rb_tree_color *)local_140._8_8_ + 1));
    }
    if (bVar8) goto LAB_00121ae2;
    std::__cxx11::string::_M_append((char *)&local_168,(ulong)(pbVar19->_M_dataplus)._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,
                      CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                               local_168.field_2._M_local_buf[0]) + 1);
    }
  }
  goto LAB_00121c95;
joined_r0x0012186a:
  if ((_Rb_tree_header *)_Var12._M_node == p_Var1) goto LAB_00121925;
  bVar8 = __gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>::operator()
                    ((_Iter_equals_val<std::__cxx11::string_const> *)&local_148,_Var12);
  if (bVar8) {
    if ((_Rb_tree_header *)_Var12._M_node != p_Var1) goto LAB_0012189d;
    goto LAB_00121925;
  }
  _Var12._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var12._M_node);
  goto joined_r0x0012186a;
LAB_00121925:
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_168);
LAB_00121935:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,
                    CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                             local_168.field_2._M_local_buf[0]) + 1);
  }
LAB_00121958:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f8);
  p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
  if (p_Var13 == local_110) goto code_r0x0012197b;
  goto LAB_0012173b;
code_r0x0012197b:
  p_Var13 = *(_Base_ptr *)(local_100 + 0x18);
  goto LAB_0012199c;
LAB_00121ae2:
  pvVar10 = Production::getToP_abi_cxx11_(local_d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_b8,pvVar10);
  pbVar3 = local_b8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar19 = local_b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  getMarker_abi_cxx11_();
  _Var11 = std::
           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                     (pbVar19,pbVar3,(_Iter_equals_val<std::__cxx11::string_const> *)&local_148);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_b8,(iterator)_Var11._M_current);
  if (local_148 != (pointer)(local_140 + 8)) {
    operator_delete(local_148,(ulong)((long)(_Rb_tree_color *)local_140._8_8_ + 1));
  }
  var = Production::getFromP_abi_cxx11_(local_d8);
  initialProductionsFromVar
            ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)&local_148
             ,var,local_108);
  for (p_Var14 = local_130; p_Var14 != (_Rb_tree_node_base *)local_140;
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
    pvVar10 = Production::getToP_abi_cxx11_(*(Production **)(p_Var14 + 1));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_d0,pvVar10);
    pbVar3 = local_d0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar19 = local_d0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    getMarker_abi_cxx11_();
    _Var11 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (pbVar19,pbVar3,local_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_d0,(iterator)_Var11._M_current);
    if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_f8._16_8_)->_M_p + 1));
    }
    if (((long)local_b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
         (long)local_d0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_d0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start) &&
       (bVar8 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                          (local_b8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_b8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           local_d0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start), bVar8)) {
      std::
      _Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
      ::_M_insert_unique<Production*const&>(local_100,&local_d8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d0);
  }
  std::
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  ::~_Rb_tree((_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
               *)&local_148);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
LAB_00121c7a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,
                    CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                             local_168.field_2._M_local_buf[0]) + 1);
  }
LAB_00121c95:
  p_Var13 = (_Base_ptr)std::_Rb_tree_increment(local_110);
  if ((GLRParser *)p_Var13 == local_118) goto LAB_00121caa;
  goto LAB_001219cc;
}

Assistant:

bool GLRParser::closure(std::set<Production *> &markedProductions, std::set<Production *> &allMarkedProductions) {
    std::set<std::string> terminalsImmRightOfMarker;
    std::set<Production *> followingTerminalInit;
    int originalMarkedProductionsSize = markedProductions.size();
    for (auto production: markedProductions) {
        std::vector<std::string> prodTo = production->getToP();
        auto it = std::find(prodTo.begin(), prodTo.end(), getMarker());
        // find the index
        int index = std::distance(prodTo.begin(), it);

        // Find the character to the immidiate right
        if (index + 1 < prodTo.size()) {
            // Check whether it's a terminal and whether it isn't included yet in the list
            std::string nextChar = prodTo.at(index + 1);
            if (std::find(terminalsT.begin(), terminalsT.end(), nextChar) != terminalsT.end() &&
                std::find(terminalsImmRightOfMarker.begin(), terminalsImmRightOfMarker.end(), prodTo.at(index + 1)) ==
                terminalsImmRightOfMarker.end()) {
                terminalsImmRightOfMarker.insert(nextChar);
//                changed = true;
            } else if (std::find(nonTerminalsV.begin(), nonTerminalsV.end(), nextChar) != nonTerminalsV.end()) {
                std::set<Production *> initProductionsFromVar = initialProductionsFromVar(nextChar,
                                                                                          allMarkedProductions);
//                for(auto prod: initProductionsFromVar){
//                    followingTerminalInit.insert(prod);
//                }
                set_union(followingTerminalInit.begin(), followingTerminalInit.end(), initProductionsFromVar.begin(),
                          initProductionsFromVar.end(),
                          std::inserter(followingTerminalInit, followingTerminalInit.begin()));
            }
        }
    }

    set_union(markedProductions.begin(), markedProductions.end(), followingTerminalInit.begin(),
              followingTerminalInit.end(), std::inserter(markedProductions, markedProductions.begin()));

    // "Then, we add to the set the initial forms of all rewrite rules in the grammar whose left-hand sides consist of
    // those nonterminals as well." -> What do they mean with consists of? Contains all of them? Only contains those? ...
    for (auto production: allMarkedProductions) {
        for (const auto &c: production->getToP()) {
            std::string str;
            if (std::find(terminalsImmRightOfMarker.begin(), terminalsImmRightOfMarker.end(), c) ==
                terminalsImmRightOfMarker.end()) {
                // The char is not in the list with specified terminals
                break;
            }
            if (c == getMarker()) {
                // this must only be the production of the form of the current production, not all first productions
                auto prodTo1 = production->getToP();
                prodTo1.erase(std::find(prodTo1.begin(), prodTo1.end(), getMarker()));
                std::set<Production *> init = initialProductionsFromVar(production->getFromP(), allMarkedProductions);
                for (auto prod: init) {
                    auto prodTo2 = prod->getToP();
                    prodTo2.erase(std::find(prodTo2.begin(), prodTo2.end(), getMarker()));
                    if (prodTo1 == prodTo2) { // TODO: check if still working (changed from if true)
                        markedProductions.insert(production);
//                        changed = true;
                    }
                }
                break;
            }
            str += c;
        }
    }

    // return whether anything has been changed

    return originalMarkedProductionsSize != markedProductions.size();
}